

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::ClassExp(SQCompiler *this)

{
  SQFuncState *pSVar1;
  long arg1;
  long lVar2;
  SQInteger SVar3;
  long arg2;
  
  lVar2 = this->_token;
  arg2 = -1;
  arg1 = arg2;
  if (lVar2 == 0x134) {
    Lex(this);
    Expression(this);
    arg1 = SQFuncState::TopTarget(this->_fs);
    lVar2 = this->_token;
  }
  if (lVar2 == 0x140) {
    Lex(this);
    pSVar1 = this->_fs;
    SVar3 = SQFuncState::PushTarget(pSVar1,-1);
    SQFuncState::AddInstruction(pSVar1,_OP_NEWOBJ,SVar3,0,0,0);
    ParseTableOrClass(this,0x2c,0x141);
    arg2 = SQFuncState::TopTarget(this->_fs);
  }
  Expect(this,0x7b);
  if (arg2 != -1) {
    SQFuncState::PopTarget(this->_fs);
  }
  if (arg1 != -1) {
    SQFuncState::PopTarget(this->_fs);
  }
  pSVar1 = this->_fs;
  SVar3 = SQFuncState::PushTarget(pSVar1,-1);
  SQFuncState::AddInstruction(pSVar1,_OP_NEWOBJ,SVar3,arg1,arg2,2);
  ParseTableOrClass(this,0x3b,0x7d);
  return;
}

Assistant:

void ClassExp()
    {
        SQInteger base = -1;
        SQInteger attrs = -1;
        if(_token == TK_EXTENDS) {
            Lex(); Expression();
            base = _fs->TopTarget();
        }
        if(_token == TK_ATTR_OPEN) {
            Lex();
            _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(),0,NOT_TABLE);
            ParseTableOrClass(_SC(','),TK_ATTR_CLOSE);
            attrs = _fs->TopTarget();
        }
        Expect(_SC('{'));
        if(attrs != -1) _fs->PopTarget();
        if(base != -1) _fs->PopTarget();
        _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(), base, attrs,NOT_CLASS);
        ParseTableOrClass(_SC(';'),_SC('}'));
    }